

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneI.cpp
# Opt level: O2

unsigned_short __thiscall
PermutazioneI::ricercaBinaria
          (PermutazioneI *this,unsigned_short *vOrdinato,unsigned_short lunghezza,
          unsigned_short valore)

{
  unsigned_short inizio;
  uint uVar1;
  unsigned_short fine;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0;
  uVar3 = (uint)lunghezza;
  while (uVar2 = uVar3, (ushort)uVar1 < (ushort)uVar2) {
    uVar4 = (uVar1 & 0xffff) + uVar2;
    uVar3 = uVar4 >> 1;
    if (*(ushort *)((long)vOrdinato + (ulong)(uVar4 & 0xfffffffe)) < valore) {
      uVar1 = uVar3 + 1;
      uVar3 = uVar2;
    }
  }
  return (ushort)uVar1;
}

Assistant:

unsigned short PermutazioneI::ricercaBinaria(unsigned short* vOrdinato, unsigned short lunghezza, 
	unsigned short valore) {

	unsigned short inizio = 0, fine = lunghezza;
	unsigned int i;

	while (inizio < fine) {
		i = (inizio + fine) / 2;
		if (valore > vOrdinato[i])
			inizio = i + 1;
		else fine = i;
	}

	return inizio;
}